

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-rand.c
# Opt level: O1

int damcalc(int num,int sides,aspect dam_aspect)

{
  uint32_t uVar1;
  int iVar2;
  
  switch(dam_aspect) {
  case MINIMISE:
    iVar2 = num;
    break;
  case AVERAGE:
    iVar2 = ((sides + 1) * num) / 2;
    break;
  case MAXIMISE:
  case EXTREMIFY:
    iVar2 = sides * num;
    break;
  case RANDOMISE:
    iVar2 = 0;
    if (0 < num && 0 < sides) {
      iVar2 = 0;
      do {
        uVar1 = Rand_div(sides);
        iVar2 = iVar2 + uVar1 + 1;
        num = num + -1;
      } while (num != 0);
    }
    break;
  default:
    __assert_fail("0 && \"Should never reach here\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-rand.c"
                  ,0x17f,"int damcalc(int, int, aspect)");
  }
  return iVar2;
}

Assistant:

int damcalc(int num, int sides, aspect dam_aspect)
{
	switch (dam_aspect) {
		case MAXIMISE:
		case EXTREMIFY: return num * sides;
		case RANDOMISE: return damroll(num, sides);
		case MINIMISE: return num;
		case AVERAGE: return num * (sides + 1) / 2;
	}

	assert(0 && "Should never reach here");
	return 0;
}